

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

lyd_node * moveto_get_root(lyd_node *cur_node,int options,lyxp_node_type *root_type)

{
  lyd_node **pplVar1;
  lyd_node *plVar2;
  lyd_node *plVar3;
  
  if (cur_node == (lyd_node *)0x0) {
    return (lyd_node *)0x0;
  }
  if (options == 0) {
    do {
      pplVar1 = &cur_node->parent;
      plVar2 = cur_node;
      cur_node = *pplVar1;
    } while (*pplVar1 != (lyd_node *)0x0);
    do {
      plVar3 = plVar2;
      plVar2 = plVar3->prev;
    } while (plVar3->prev->next != (lyd_node *)0x0);
    *root_type = LYXP_NODE_ROOT;
  }
  else {
    *root_type = cur_node->schema->flags & LYXP_NODE_ROOT_CONFIG;
    do {
      pplVar1 = &cur_node->parent;
      plVar2 = cur_node;
      cur_node = *pplVar1;
    } while (*pplVar1 != (lyd_node *)0x0);
    do {
      plVar3 = plVar2;
      plVar2 = plVar3->prev;
    } while (plVar3->prev->next != (lyd_node *)0x0);
  }
  return plVar3;
}

Assistant:

static const struct lyd_node *
moveto_get_root(const struct lyd_node *cur_node, int options, enum lyxp_node_type *root_type)
{
    const struct lyd_node *root;

    if (!cur_node) {
        return NULL;
    }

    if (!options) {
        /* special kind of root that can access everything */
        for (root = cur_node; root->parent; root = root->parent);
        for (; root->prev->next; root = root->prev);
        *root_type = LYXP_NODE_ROOT;
        return root;
    }

    if (cur_node->schema->flags & LYS_CONFIG_W) {
        *root_type = LYXP_NODE_ROOT_CONFIG;
    } else {
        *root_type = LYXP_NODE_ROOT;
    }

    for (root = cur_node; root->parent; root = root->parent);
    for (; root->prev->next; root = root->prev);

    return root;
}